

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_Print(FParser *this)

{
  char *pcVar1;
  FParser *local_10;
  FParser *this_local;
  
  local_10 = this;
  GetFormatString((FParser *)&stack0xffffffffffffffe8,(int)this);
  pcVar1 = FString::GetChars((FString *)&stack0xffffffffffffffe8);
  Printf(2,"%s\n",pcVar1);
  FString::~FString((FString *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void FParser::SF_Print(void)
{
	Printf(PRINT_HIGH, "%s\n", GetFormatString(0).GetChars());
}